

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O0

void duckdb::ReadDataFromPrimitiveSegment<long>
               (ListSegmentFunctions *param_1,ListSegment *segment,Vector *result,idx_t *total_count
               )

{
  bool bVar1;
  bool *pbVar2;
  long *plVar3;
  const_data_ptr_t ptr;
  long lVar4;
  long *in_RCX;
  ushort *in_RSI;
  long *data;
  idx_t i_1;
  long *aggr_vector_data;
  idx_t i;
  bool *null_mask;
  ValidityMask *aggr_vector_validity;
  idx_t in_stack_ffffffffffffffa8;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *this;
  ulong local_38;
  
  FlatVector::Validity((Vector *)0x3e9cf2);
  pbVar2 = GetNullMask((ListSegment *)0x3e9d01);
  for (local_38 = 0; local_38 < *in_RSI; local_38 = local_38 + 1) {
    if ((pbVar2[local_38] & 1U) != 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  plVar3 = FlatVector::GetData<long>((Vector *)0x3e9d64);
  for (this = (TemplatedValidityMask<unsigned_long> *)0x0;
      this < (TemplatedValidityMask<unsigned_long> *)(ulong)*in_RSI;
      this = (TemplatedValidityMask<unsigned_long> *)((long)&this->validity_mask + 1)) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this,(idx_t)in_stack_ffffffffffffffb0);
    if (bVar1) {
      in_stack_ffffffffffffffb0 =
           (TemplatedValidityMask<unsigned_long> *)GetPrimitiveData<long>((ListSegment *)0x3e9dab);
      ptr = const_data_ptr_cast<long>
                      ((long *)(&in_stack_ffffffffffffffb0->validity_mask + (long)this));
      lVar4 = Load<long>(ptr);
      plVar3[(long)&this->validity_mask + *in_RCX] = lVar4;
    }
  }
  return;
}

Assistant:

static void ReadDataFromPrimitiveSegment(const ListSegmentFunctions &, const ListSegment *segment, Vector &result,
                                         idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto aggr_vector_data = FlatVector::GetData<T>(result);

	// load values
	for (idx_t i = 0; i < segment->count; i++) {
		if (aggr_vector_validity.RowIsValid(total_count + i)) {
			auto data = GetPrimitiveData<T>(segment);
			aggr_vector_data[total_count + i] = Load<T>(const_data_ptr_cast(data + i));
		}
	}
}